

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::find<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,initializer_list<int> *s
          )

{
  int *__first;
  int *__last;
  iterator __first_00;
  iterator __last_00;
  initializer_list<int> *in_RDX;
  allocator<int> local_69;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> copy;
  int *last;
  int *first;
  initializer_list<int> *s_local;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this_local;
  
  __first = std::begin<int>(*in_RDX);
  copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_RDX->_M_array;
  __last = std::end<int>(*in_RDX);
  if (__first == __last) {
    null_simplex();
  }
  else {
    std::allocator<int>::allocator(&local_69);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)local_68,__first,__last,&local_69);
    std::allocator<int>::~allocator(&local_69);
    __first_00 = std::begin<std::vector<int,std::allocator<int>>>
                           ((vector<int,_std::allocator<int>_> *)local_68);
    __last_00 = std::end<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)local_68);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __first_00._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __last_00._M_current);
    find_simplex(this,(vector<int,_std::allocator<int>_> *)s);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  }
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }